

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O0

void __thiscall QPrinterPrivate::setPreviewMode(QPrinterPrivate *this,bool enable)

{
  QPrinter *paintEngine;
  QPreviewPaintEngine *pQVar1;
  byte in_SIL;
  QPrinterPrivate *in_RDI;
  QPrinter *q;
  QPaintEngine *in_stack_ffffffffffffffc0;
  QPrintEngine *in_stack_ffffffffffffffc8;
  QPreviewPaintEngine *in_stack_ffffffffffffffd0;
  QPreviewPaintEngine *this_00;
  
  paintEngine = q_func(in_RDI);
  if ((in_SIL & 1) == 0) {
    QPrinter::setEngines
              ((QPrinter *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
    in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfe | (byte)in_RDI->field_0x44 >> 1 & 1;
  }
  else {
    if (in_RDI->previewEngine == (QPreviewPaintEngine *)0x0) {
      pQVar1 = (QPreviewPaintEngine *)operator_new(0x28);
      QPreviewPaintEngine::QPreviewPaintEngine(in_stack_ffffffffffffffd0);
      in_RDI->previewEngine = pQVar1;
    }
    in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfd | (in_RDI->field_0x44 & 1) << 1;
    in_RDI->field_0x44 = in_RDI->field_0x44 & 0xfe;
    in_RDI->realPrintEngine = in_RDI->printEngine;
    in_RDI->realPaintEngine = in_RDI->paintEngine;
    pQVar1 = in_RDI->previewEngine;
    this_00 = (QPreviewPaintEngine *)0x0;
    if (pQVar1 != (QPreviewPaintEngine *)0x0) {
      this_00 = (QPreviewPaintEngine *)&pQVar1->super_QPrintEngine;
    }
    QPrinter::setEngines((QPrinter *)this_00,(QPrintEngine *)pQVar1,(QPaintEngine *)paintEngine);
    QPreviewPaintEngine::setProxyEngines(this_00,(QPrintEngine *)pQVar1,(QPaintEngine *)paintEngine)
    ;
  }
  return;
}

Assistant:

void QPrinterPrivate::setPreviewMode(bool enable)
{
    Q_Q(QPrinter);
    if (enable) {
        if (!previewEngine)
            previewEngine = new QPreviewPaintEngine;
        had_default_engines = use_default_engine;
        use_default_engine = false;
        realPrintEngine = printEngine;
        realPaintEngine = paintEngine;
        q->setEngines(previewEngine, previewEngine);
        previewEngine->setProxyEngines(realPrintEngine, realPaintEngine);
    } else {
        q->setEngines(realPrintEngine, realPaintEngine);
        use_default_engine = had_default_engines;
    }
}